

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlslangToSpv.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_889438::TGlslangToSpvTraverser::makeFunctions
          (TGlslangToSpvTraverser *this,TIntermSequence *glslFunctions)

{
  vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_> *this_00;
  bool bVar1;
  int iVar2;
  TOperator TVar3;
  int iVar4;
  EShSource EVar5;
  StorageClass storageClass;
  Decoration precision;
  Id IVar6;
  TLinkType linkType;
  LinkageType linkType_00;
  size_type sVar7;
  const_reference ppTVar8;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  char *pcVar9;
  undefined4 extraout_var_02;
  reference ppTVar10;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *pbVar11;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  reference decorations;
  reference ppTVar12;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  Function *pFVar13;
  undefined4 extraout_var_13;
  undefined4 extraout_var_14;
  mapped_type *ppFVar14;
  undefined4 extraout_var_15;
  mapped_type *pmVar15;
  undefined4 extraout_var_16;
  undefined4 extraout_var_17;
  TType *pTVar16;
  bool local_189;
  bool local_181;
  TType *paramType_1;
  int local_140;
  allocator<char> local_139;
  int p_1;
  Function *local_118;
  Function *function;
  Block *functionBlock;
  TIntermNode *local_100;
  TIntermNode *parameter;
  iterator __end2;
  iterator __begin2;
  TIntermSequence *__range2;
  value_type local_d0;
  Id local_c4;
  TType *pTStack_c0;
  Id typeId;
  TType *paramType;
  int p;
  bool implicitThis;
  TIntermSequence *parameters;
  vector<std::vector<spv::Decoration,_std::allocator<spv::Decoration>_>,_std::allocator<std::vector<spv::Decoration,_std::allocator<spv::Decoration>_>_>_>
  paramDecorations;
  vector<const_char_*,_std::allocator<const_char_*>_> paramNames;
  vector<unsigned_int,_std::allocator<unsigned_int>_> paramTypes;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_48;
  TIntermAggregate *local_30;
  TIntermAggregate *glslFunction;
  anon_class_8_1_8991fb9c aStack_20;
  int f;
  anon_class_8_1_8991fb9c getParamDecorations;
  TIntermSequence *glslFunctions_local;
  TGlslangToSpvTraverser *this_local;
  
  aStack_20.this = this;
  getParamDecorations.this = (TGlslangToSpvTraverser *)glslFunctions;
  for (glslFunction._4_4_ = 0; iVar2 = glslFunction._4_4_,
      sVar7 = std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::size
                        ((vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_> *)
                         getParamDecorations.this), iVar2 < (int)sVar7;
      glslFunction._4_4_ = glslFunction._4_4_ + 1) {
    ppTVar8 = std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::operator[]
                        ((vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_> *)
                         getParamDecorations.this,(long)glslFunction._4_4_);
    iVar2 = (*(*ppTVar8)->_vptr_TIntermNode[6])();
    local_30 = (TIntermAggregate *)CONCAT44(extraout_var,iVar2);
    if ((local_30 != (TIntermAggregate *)0x0) &&
       (TVar3 = glslang::TIntermOperator::getOp((TIntermOperator *)local_30), TVar3 == EOpFunction))
    {
      iVar2 = (**(local_30->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                 _vptr_TIntermNode)();
      iVar2 = *(int *)(CONCAT44(extraout_var_00,iVar2) + 0xc);
      iVar4 = (**(local_30->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                 _vptr_TIntermNode)();
      pcVar9 = glslang::TSourceLoc::getFilename((TSourceLoc *)CONCAT44(extraout_var_01,iVar4));
      spv::Builder::setDebugSourceLocation(&this->builder,iVar2,pcVar9);
      bVar1 = isShaderEntryPoint(this,local_30);
      if (bVar1) {
        EVar5 = glslang::TIntermediate::getSource(this->glslangIntermediate);
        if (EVar5 != EShSourceHlsl) {
          pFVar13 = this->shaderEntry;
          glslang::TIntermediate::getEntryPointMangledName_abi_cxx11_(this->glslangIntermediate);
          pcVar9 = (char *)std::__cxx11::string::c_str();
          memset(&local_48,0,0x18);
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_48);
          memset(&paramTypes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                  .super__Vector_impl_data._M_end_of_storage,0,0x18);
          std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
                    ((vector<const_char_*,_std::allocator<const_char_*>_> *)
                     &paramTypes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage);
          spv::Builder::setupFunctionDebugInfo
                    (&this->builder,pFVar13,pcVar9,&local_48,
                     (vector<const_char_*,_std::allocator<const_char_*>_> *)
                     &paramTypes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage);
          std::vector<const_char_*,_std::allocator<const_char_*>_>::~vector
                    ((vector<const_char_*,_std::allocator<const_char_*>_> *)
                     &paramTypes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage);
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_48);
        }
      }
      else {
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                   &paramNames.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage);
        std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
                  ((vector<const_char_*,_std::allocator<const_char_*>_> *)
                   &paramDecorations.
                    super__Vector_base<std::vector<spv::Decoration,_std::allocator<spv::Decoration>_>,_std::allocator<std::vector<spv::Decoration,_std::allocator<spv::Decoration>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
        std::
        vector<std::vector<spv::Decoration,_std::allocator<spv::Decoration>_>,_std::allocator<std::vector<spv::Decoration,_std::allocator<spv::Decoration>_>_>_>
        ::vector((vector<std::vector<spv::Decoration,_std::allocator<spv::Decoration>_>,_std::allocator<std::vector<spv::Decoration,_std::allocator<spv::Decoration>_>_>_>
                  *)&parameters);
        iVar2 = (*(local_30->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                  _vptr_TIntermNode[0x32])();
        ppTVar10 = std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::operator[]
                             ((vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_> *)
                              CONCAT44(extraout_var_02,iVar2),0);
        iVar2 = (*(*ppTVar10)->_vptr_TIntermNode[6])();
        _p = (vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_> *)
             (**(code **)(*(long *)CONCAT44(extraout_var_03,iVar2) + 400))();
        sVar7 = std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::size(_p);
        local_181 = false;
        if (0 < (int)sVar7) {
          ppTVar10 = std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::operator[]
                               (_p,0);
          iVar2 = (*(*ppTVar10)->_vptr_TIntermNode[0xc])();
          pbVar11 = (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
                    (**(code **)(*(long *)CONCAT44(extraout_var_04,iVar2) + 400))();
          local_181 = std::operator==(pbVar11,this->glslangIntermediate->implicitThisName);
        }
        paramType._7_1_ = local_181;
        sVar7 = std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::size(_p);
        std::
        vector<std::vector<spv::Decoration,_std::allocator<spv::Decoration>_>,_std::allocator<std::vector<spv::Decoration,_std::allocator<spv::Decoration>_>_>_>
        ::resize((vector<std::vector<spv::Decoration,_std::allocator<spv::Decoration>_>,_std::allocator<std::vector<spv::Decoration,_std::allocator<spv::Decoration>_>_>_>
                  *)&parameters,sVar7);
        for (paramType._0_4_ = 0; iVar2 = (int)paramType,
            sVar7 = std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::size(_p),
            this_00 = _p, iVar2 < (int)sVar7; paramType._0_4_ = (int)paramType + 1) {
          ppTVar10 = std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::operator[]
                               (_p,(long)(int)paramType);
          iVar2 = (*(*ppTVar10)->_vptr_TIntermNode[3])();
          pTStack_c0 = (TType *)(**(code **)(*(long *)CONCAT44(extraout_var_05,iVar2) + 0xf0))();
          local_c4 = convertGlslangToSpvType(this,pTStack_c0,false);
          iVar2 = (*pTStack_c0->_vptr_TType[0xb])();
          local_189 = (paramType._7_1_ & 1) != 0 && (int)paramType == 0;
          bVar1 = originalParam(this,(TStorageQualifier)
                                     *(undefined8 *)(CONCAT44(extraout_var_06,iVar2) + 8) & 0x7f,
                                pTStack_c0,local_189);
          if (bVar1) {
            storageClass = TranslateStorageClass(this,pTStack_c0);
            local_c4 = spv::Builder::makePointer(&this->builder,storageClass,local_c4);
          }
          else {
            iVar2 = (*pTStack_c0->_vptr_TType[0xb])();
            bVar1 = writableParam(this,(TStorageQualifier)
                                       *(undefined8 *)(CONCAT44(extraout_var_07,iVar2) + 8) & 0x7f);
            if (bVar1) {
              local_c4 = spv::Builder::makePointer(&this->builder,Function,local_c4);
            }
            else {
              ppTVar10 = std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::
                         operator[](_p,(long)(int)paramType);
              iVar2 = (*(*ppTVar10)->_vptr_TIntermNode[0xc])();
              local_d0 = (**(code **)(*(long *)CONCAT44(extraout_var_08,iVar2) + 0x180))();
              std::
              unordered_set<long_long,_std::hash<long_long>,_std::equal_to<long_long>,_std::allocator<long_long>_>
              ::insert(&this->rValueParameters,&local_d0);
            }
          }
          decorations = std::
                        vector<std::vector<spv::Decoration,_std::allocator<spv::Decoration>_>,_std::allocator<std::vector<spv::Decoration,_std::allocator<spv::Decoration>_>_>_>
                        ::operator[]((vector<std::vector<spv::Decoration,_std::allocator<spv::Decoration>_>,_std::allocator<std::vector<spv::Decoration,_std::allocator<spv::Decoration>_>_>_>
                                      *)&parameters,(long)(int)paramType);
          pTVar16 = pTStack_c0;
          bVar1 = glslang::TIntermediate::usingVulkanMemoryModel(this->glslangIntermediate);
          makeFunctions::anon_class_8_1_8991fb9c::operator()
                    (&stack0xffffffffffffffe0,decorations,pTVar16,bVar1);
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                     &paramNames.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage,&local_c4);
        }
        __end2 = std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::begin(_p);
        parameter = (TIntermNode *)
                    std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::end
                              (this_00);
        while (bVar1 = __gnu_cxx::operator!=
                                 (&__end2,(__normal_iterator<TIntermNode_**,_std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>_>
                                           *)&parameter), bVar1) {
          ppTVar12 = __gnu_cxx::
                     __normal_iterator<TIntermNode_**,_std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>_>
                     ::operator*(&__end2);
          local_100 = *ppTVar12;
          iVar2 = (*local_100->_vptr_TIntermNode[0xc])();
          pbVar11 = (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
                    (**(code **)(*(long *)CONCAT44(extraout_var_09,iVar2) + 400))();
          functionBlock =
               (Block *)std::__cxx11::
                        basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                        c_str(pbVar11);
          std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
                    ((vector<const_char_*,_std::allocator<const_char_*>_> *)
                     &paramDecorations.
                      super__Vector_base<std::vector<spv::Decoration,_std::allocator<spv::Decoration>_>,_std::allocator<std::vector<spv::Decoration,_std::allocator<spv::Decoration>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,
                     (value_type *)&functionBlock);
          __gnu_cxx::
          __normal_iterator<TIntermNode_**,_std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>_>
          ::operator++(&__end2);
        }
        iVar2 = (*(local_30->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                  _vptr_TIntermNode[0x1e])();
        precision = TranslatePrecisionDecoration((TType *)CONCAT44(extraout_var_10,iVar2));
        iVar2 = (*(local_30->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                  _vptr_TIntermNode[0x1e])();
        IVar6 = convertGlslangToSpvType(this,(TType *)CONCAT44(extraout_var_11,iVar2),false);
        iVar2 = (*(local_30->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                  _vptr_TIntermNode[0x35])();
        pcVar9 = std::__cxx11::
                 basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::c_str
                           ((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                             *)CONCAT44(extraout_var_12,iVar2));
        linkType = glslang::TIntermAggregate::getLinkType(local_30);
        linkType_00 = convertGlslangLinkageToSpv(this,linkType);
        pFVar13 = spv::Builder::makeFunctionEntry
                            (&this->builder,precision,IVar6,pcVar9,linkType_00,
                             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                             &paramNames.
                              super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage,
                             (vector<std::vector<spv::Decoration,_std::allocator<spv::Decoration>_>,_std::allocator<std::vector<spv::Decoration,_std::allocator<spv::Decoration>_>_>_>
                              *)&parameters,(Block **)&function);
        local_118 = pFVar13;
        iVar2 = (*(local_30->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                  _vptr_TIntermNode[0x35])();
        pcVar9 = std::__cxx11::
                 basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::c_str
                           ((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                             *)CONCAT44(extraout_var_13,iVar2));
        spv::Builder::setupFunctionDebugInfo
                  (&this->builder,pFVar13,pcVar9,
                   (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                   &paramNames.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage,
                   (vector<const_char_*,_std::allocator<const_char_*>_> *)
                   &paramDecorations.
                    super__Vector_base<std::vector<spv::Decoration,_std::allocator<spv::Decoration>_>,_std::allocator<std::vector<spv::Decoration,_std::allocator<spv::Decoration>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
        if ((paramType._7_1_ & 1) != 0) {
          spv::Function::setImplicitThis(local_118);
        }
        pFVar13 = local_118;
        iVar2 = (*(local_30->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                  _vptr_TIntermNode[0x35])();
        pcVar9 = std::__cxx11::
                 basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::c_str
                           ((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                             *)CONCAT44(extraout_var_14,iVar2));
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&p_1,pcVar9,&local_139);
        ppFVar14 = std::
                   unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_spv::Function_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_spv::Function_*>_>_>
                   ::operator[](&this->functionMap,(key_type *)&p_1);
        *ppFVar14 = pFVar13;
        std::__cxx11::string::~string((string *)&p_1);
        std::allocator<char>::~allocator(&local_139);
        for (local_140 = 0; iVar2 = local_140,
            sVar7 = std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::size(_p),
            iVar2 < (int)sVar7; local_140 = local_140 + 1) {
          IVar6 = spv::Function::getParamId(local_118,local_140);
          ppTVar10 = std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::operator[]
                               (_p,(long)local_140);
          iVar2 = (*(*ppTVar10)->_vptr_TIntermNode[0xc])();
          paramType_1 = (TType *)(**(code **)(*(long *)CONCAT44(extraout_var_15,iVar2) + 0x180))();
          pmVar15 = std::
                    unordered_map<long_long,_unsigned_int,_std::hash<long_long>,_std::equal_to<long_long>,_std::allocator<std::pair<const_long_long,_unsigned_int>_>_>
                    ::operator[](&this->symbolValues,(key_type *)&paramType_1);
          *pmVar15 = IVar6;
          IVar6 = spv::Function::getParamId(local_118,local_140);
          ppTVar10 = std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::operator[]
                               (_p,(long)local_140);
          iVar2 = (*(*ppTVar10)->_vptr_TIntermNode[0xc])();
          pbVar11 = (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
                    (**(code **)(*(long *)CONCAT44(extraout_var_16,iVar2) + 400))();
          pcVar9 = std::__cxx11::
                   basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::c_str
                             (pbVar11);
          spv::Builder::addName(&this->builder,IVar6,pcVar9);
          ppTVar10 = std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::operator[]
                               (_p,(long)local_140);
          iVar2 = (*(*ppTVar10)->_vptr_TIntermNode[3])();
          pTVar16 = (TType *)(**(code **)(*(long *)CONCAT44(extraout_var_17,iVar2) + 0xf0))();
          bVar1 = glslang::TType::contains8BitInt(pTVar16);
          if (bVar1) {
            spv::Builder::addCapability(&this->builder,CapabilityInt8);
          }
          bVar1 = glslang::TType::contains16BitInt(pTVar16);
          if (bVar1) {
            spv::Builder::addCapability(&this->builder,CapabilityInt16);
          }
          bVar1 = glslang::TType::contains16BitFloat(pTVar16);
          if (bVar1) {
            spv::Builder::addCapability(&this->builder,CapabilityFloat16);
          }
        }
        std::
        vector<std::vector<spv::Decoration,_std::allocator<spv::Decoration>_>,_std::allocator<std::vector<spv::Decoration,_std::allocator<spv::Decoration>_>_>_>
        ::~vector((vector<std::vector<spv::Decoration,_std::allocator<spv::Decoration>_>,_std::allocator<std::vector<spv::Decoration,_std::allocator<spv::Decoration>_>_>_>
                   *)&parameters);
        std::vector<const_char_*,_std::allocator<const_char_*>_>::~vector
                  ((vector<const_char_*,_std::allocator<const_char_*>_> *)
                   &paramDecorations.
                    super__Vector_base<std::vector<spv::Decoration,_std::allocator<spv::Decoration>_>,_std::allocator<std::vector<spv::Decoration,_std::allocator<spv::Decoration>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                   &paramNames.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage);
      }
    }
  }
  return;
}

Assistant:

void TGlslangToSpvTraverser::makeFunctions(const glslang::TIntermSequence& glslFunctions)
{
    const auto getParamDecorations = [&](std::vector<spv::Decoration>& decorations, const glslang::TType& type,
        bool useVulkanMemoryModel) {
        spv::Decoration paramPrecision = TranslatePrecisionDecoration(type);
        if (paramPrecision != spv::NoPrecision)
            decorations.push_back(paramPrecision);
        TranslateMemoryDecoration(type.getQualifier(), decorations, useVulkanMemoryModel);
        if (type.isReference()) {
            // Original and non-writable params pass the pointer directly and
            // use restrict/aliased, others are stored to a pointer in Function
            // memory and use RestrictPointer/AliasedPointer.
            if (originalParam(type.getQualifier().storage, type, false) ||
                !writableParam(type.getQualifier().storage)) {
                // TranslateMemoryDecoration added Restrict decoration already.
                if (!type.getQualifier().isRestrict()) {
                    decorations.push_back(spv::DecorationAliased);
                }
            } else {
                decorations.push_back(type.getQualifier().isRestrict() ? spv::DecorationRestrictPointerEXT :
                                                                         spv::DecorationAliasedPointerEXT);
            }
        }
    };

    for (int f = 0; f < (int)glslFunctions.size(); ++f) {
        glslang::TIntermAggregate* glslFunction = glslFunctions[f]->getAsAggregate();
        if (! glslFunction || glslFunction->getOp() != glslang::EOpFunction)
            continue;

        builder.setDebugSourceLocation(glslFunction->getLoc().line, glslFunction->getLoc().getFilename());

        if (isShaderEntryPoint(glslFunction)) {
            // For HLSL, the entry function is actually a compiler generated function to resolve the difference of
            // entry function signature between HLSL and SPIR-V. So we don't emit debug information for that.
            if (glslangIntermediate->getSource() != glslang::EShSourceHlsl) {
                builder.setupFunctionDebugInfo(shaderEntry, glslangIntermediate->getEntryPointMangledName().c_str(),
                                               std::vector<spv::Id>(), // main function has no param
                                               std::vector<char const*>());
            }
            continue;
        }
        // We're on a user function.  Set up the basic interface for the function now,
        // so that it's available to call.  Translating the body will happen later.
        //
        // Typically (except for a "const in" parameter), an address will be passed to the
        // function.  What it is an address of varies:
        //
        // - "in" parameters not marked as "const" can be written to without modifying the calling
        //   argument so that write needs to be to a copy, hence the address of a copy works.
        //
        // - "const in" parameters can just be the r-value, as no writes need occur.
        //
        // - "out" and "inout" arguments can't be done as pointers to the calling argument, because
        //   GLSL has copy-in/copy-out semantics.  They can be handled though with a pointer to a copy.

        std::vector<spv::Id> paramTypes;
        std::vector<char const*> paramNames;
        std::vector<std::vector<spv::Decoration>> paramDecorations; // list of decorations per parameter
        glslang::TIntermSequence& parameters = glslFunction->getSequence()[0]->getAsAggregate()->getSequence();

#ifdef ENABLE_HLSL
        bool implicitThis = (int)parameters.size() > 0 && parameters[0]->getAsSymbolNode()->getName() ==
                                                          glslangIntermediate->implicitThisName;
#else
        bool implicitThis = false;
#endif

        paramDecorations.resize(parameters.size());
        for (int p = 0; p < (int)parameters.size(); ++p) {
            const glslang::TType& paramType = parameters[p]->getAsTyped()->getType();
            spv::Id typeId = convertGlslangToSpvType(paramType);
            if (originalParam(paramType.getQualifier().storage, paramType, implicitThis && p == 0))
                typeId = builder.makePointer(TranslateStorageClass(paramType), typeId);
            else if (writableParam(paramType.getQualifier().storage))
                typeId = builder.makePointer(spv::StorageClassFunction, typeId);
            else
                rValueParameters.insert(parameters[p]->getAsSymbolNode()->getId());
            getParamDecorations(paramDecorations[p], paramType, glslangIntermediate->usingVulkanMemoryModel());
            paramTypes.push_back(typeId);
        }

        for (auto const parameter:parameters) {
            paramNames.push_back(parameter->getAsSymbolNode()->getName().c_str());
        }

        spv::Block* functionBlock;
        spv::Function* function = builder.makeFunctionEntry(
            TranslatePrecisionDecoration(glslFunction->getType()), convertGlslangToSpvType(glslFunction->getType()),
            glslFunction->getName().c_str(), convertGlslangLinkageToSpv(glslFunction->getLinkType()), paramTypes,
            paramDecorations, &functionBlock);
        builder.setupFunctionDebugInfo(function, glslFunction->getName().c_str(), paramTypes, paramNames);
        if (implicitThis)
            function->setImplicitThis();

        // Track function to emit/call later
        functionMap[glslFunction->getName().c_str()] = function;

        // Set the parameter id's
        for (int p = 0; p < (int)parameters.size(); ++p) {
            symbolValues[parameters[p]->getAsSymbolNode()->getId()] = function->getParamId(p);
            // give a name too
            builder.addName(function->getParamId(p), parameters[p]->getAsSymbolNode()->getName().c_str());

            const glslang::TType& paramType = parameters[p]->getAsTyped()->getType();
            if (paramType.contains8BitInt())
                builder.addCapability(spv::CapabilityInt8);
            if (paramType.contains16BitInt())
                builder.addCapability(spv::CapabilityInt16);
            if (paramType.contains16BitFloat())
                builder.addCapability(spv::CapabilityFloat16);
        }
    }
}